

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_ring.h
# Opt level: O3

void __thiscall
embree::GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::convert
          (GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          CatmullClark1Ring *dst)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  uint uVar4;
  vfloat_impl<4> *pvVar5;
  undefined8 uVar6;
  size_t i;
  float *pfVar7;
  vfloat_impl<4> *pvVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  vfloat_impl<4> *local_38;
  
  dst->edge_level = this->edge_level;
  dst->vertex_level = this->vertex_level;
  uVar6 = *(undefined8 *)((long)&(this->vtx).field_0 + 8);
  *(undefined8 *)&(dst->vtx).field_0 = *(undefined8 *)&(this->vtx).field_0;
  *(undefined8 *)((long)&(dst->vtx).field_0 + 8) = uVar6;
  uVar4 = this->face_valence;
  dst->face_valence = uVar4;
  dst->edge_valence = uVar4 * 2;
  iVar9 = this->border_face * 2;
  if (this->border_face == -1) {
    iVar9 = -1;
  }
  dst->border_index = iVar9;
  if (this->face_valence != 0) {
    uVar11 = 0;
    do {
      fVar3 = (this->faces).data[uVar11].crease_weight;
      pfVar7 = (dst->crease_weight).data;
      if ((0xf < uVar11) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar7 == &dst->crease_weight))
      {
        pfVar7 = (float *)operator_new__(0x100);
        (dst->crease_weight).data = pfVar7;
        lVar10 = 0;
        do {
          (dst->crease_weight).data[lVar10] = (dst->crease_weight).arr[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
        pfVar7 = (dst->crease_weight).data;
      }
      pfVar7[uVar11] = fVar3;
      uVar11 = uVar11 + 1;
    } while (uVar11 < this->face_valence);
  }
  dst->vertex_crease_weight = this->vertex_crease_weight;
  if (this->edge_valence != 0) {
    lVar10 = 0;
    uVar11 = 0;
    do {
      pvVar5 = (this->ring).data;
      pvVar8 = (dst->ring).data;
      if ((0x1f < uVar11) &&
         ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar8 == &dst->ring)) {
        GeneralCatmullClark1RingT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::convert();
        pvVar8 = local_38;
      }
      uVar11 = uVar11 + 1;
      puVar1 = (undefined8 *)((long)&pvVar5->field_0 + lVar10);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar8->field_0 + lVar10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      lVar10 = lVar10 + 0x10;
    } while (uVar11 < this->edge_valence);
  }
  dst->eval_start_index = this->eval_start_face_index;
  dst->eval_unique_identifier = this->eval_unique_identifier;
  return;
}

Assistant:

void convert(CatmullClark1Ring& dst) const
    {
      dst.edge_level = edge_level;
      dst.vertex_level = vertex_level;
      dst.vtx = vtx;
      dst.face_valence = face_valence;
      dst.edge_valence = 2*face_valence;
      dst.border_index = border_face == -1 ? -1 : 2*border_face;
      for (size_t i=0; i<face_valence; i++) 
	dst.crease_weight[i] = faces[i].crease_weight;
      dst.vertex_crease_weight = vertex_crease_weight;
      for (size_t i=0; i<edge_valence; i++) dst.ring[i] = ring[i];

      dst.eval_start_index = eval_start_face_index;
      dst.eval_unique_identifier = eval_unique_identifier;

      assert( dst.hasValidPositions() );
    }